

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringWriter.cpp
# Opt level: O1

void __thiscall
ApprovalTests::StringWriter::StringWriter
          (StringWriter *this,string *contents,string *fileExtensionWithDot)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_ApprovalWriter)._vptr_ApprovalWriter = (_func_int **)&PTR__StringWriter_001426f0;
  paVar1 = &(this->s).field_2;
  (this->s)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (contents->_M_dataplus)._M_p;
  paVar2 = &contents->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&contents->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->s).field_2 + 8) = uVar4;
  }
  else {
    (this->s)._M_dataplus._M_p = pcVar3;
    (this->s).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->s)._M_string_length = contents->_M_string_length;
  (contents->_M_dataplus)._M_p = (pointer)paVar2;
  contents->_M_string_length = 0;
  (contents->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->ext).field_2;
  (this->ext)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (fileExtensionWithDot->_M_dataplus)._M_p;
  paVar2 = &fileExtensionWithDot->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&fileExtensionWithDot->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ext).field_2 + 8) = uVar4;
  }
  else {
    (this->ext)._M_dataplus._M_p = pcVar3;
    (this->ext).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->ext)._M_string_length = fileExtensionWithDot->_M_string_length;
  (fileExtensionWithDot->_M_dataplus)._M_p = (pointer)paVar2;
  fileExtensionWithDot->_M_string_length = 0;
  (fileExtensionWithDot->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

StringWriter::StringWriter(std::string contents, std::string fileExtensionWithDot)
        : s(std::move(contents)), ext(std::move(fileExtensionWithDot))
    {
    }